

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O2

uint32 Unicode::fromString(char *ch,usize len)

{
  char ch_00;
  byte bVar1;
  usize uVar2;
  int iVar3;
  int iVar4;
  
  if (len == 0) {
    return 0;
  }
  ch_00 = *ch;
  if (-1 < ch_00) {
    return (int)ch_00;
  }
  uVar2 = length(ch_00);
  if (len < uVar2) {
    return 0;
  }
  iVar4 = 0;
  iVar3 = 0;
  if (uVar2 != 2) {
    if (uVar2 != 3) {
      if (uVar2 != 4) goto LAB_00106a8f;
      bVar1 = *ch;
      ch = ch + 1;
      iVar3 = (uint)bVar1 << 6;
    }
    bVar1 = *ch;
    ch = (char *)((byte *)ch + 1);
    iVar4 = ((uint)bVar1 + iVar3) * 0x40;
  }
  bVar1 = *ch;
  ch = (char *)((byte *)ch + 1);
  iVar4 = ((uint)bVar1 + iVar4) * 0x40;
LAB_00106a8f:
  return ((uint)(byte)*ch + iVar4) - fromString::utf8Offsets[uVar2];
}

Assistant:

static uint32 fromString(const char* ch, usize len)
  {
    if(len == 0)
      return 0;
    if((*(const uchar*)ch & 0x80) == 0) // ch < 0x80
      return *(const uchar*)ch;
    usize reqLen = length(*ch);
    if(len < reqLen)
      return 0;
    static const uint32 utf8Offsets[] = {0UL, 0UL, 0x00003080UL, 0x000E2080UL, 0x03C82080UL};
    uint32 result = 0;
    switch(reqLen)
    {
      case 4: result = (uint32)*(const uchar*)ch++ << 6;
      case 3: result += (uint32)*(const uchar*)ch++; result <<= 6;
      case 2: result += (uint32)*(const uchar*)ch++; result <<= 6;
      default: result += *(const uchar*)ch;
    }
    result -= utf8Offsets[reqLen];
    return result;
  }